

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void PickSeeds(ON_RTreePartitionVars *a_parVars)

{
  int iVar1;
  double dVar2;
  undefined1 local_a8 [8];
  ON_RTreeBBox oneRect;
  int local_70;
  int indexB;
  int indexA;
  int index;
  double area [7];
  double waste;
  double worst;
  int seed1;
  int seed0;
  ON_RTreePartitionVars *a_parVars_local;
  
  worst._4_4_ = 0;
  worst._0_4_ = 1;
  for (indexB = 0; indexB < a_parVars->m_total; indexB = indexB + 1) {
    dVar2 = CalcRectVolumeHelper(&a_parVars->m_branchBuf[indexB].m_rect);
    *(double *)(&indexA + (long)indexB * 2) = dVar2;
  }
  waste = -a_parVars->m_coverSplitArea - 1.0;
  for (local_70 = 0; iVar1 = local_70, local_70 < a_parVars->m_total + -1; local_70 = local_70 + 1)
  {
    while (oneRect.m_max[2]._4_4_ = iVar1 + 1, oneRect.m_max[2]._4_4_ < a_parVars->m_total) {
      CombineRectHelper((ON_RTreeBBox *)local_a8,&a_parVars->m_branchBuf[local_70].m_rect,
                        &a_parVars->m_branchBuf[oneRect.m_max[2]._4_4_].m_rect);
      dVar2 = CalcRectVolumeHelper((ON_RTreeBBox *)local_a8);
      dVar2 = (dVar2 - *(double *)(&indexA + (long)local_70 * 2)) -
              *(double *)(&indexA + (long)oneRect.m_max[2]._4_4_ * 2);
      iVar1 = oneRect.m_max[2]._4_4_;
      if (waste < dVar2) {
        worst._4_4_ = local_70;
        worst._0_4_ = oneRect.m_max[2]._4_4_;
        waste = dVar2;
      }
    }
  }
  ClassifyHelper(worst._4_4_,0,a_parVars);
  ClassifyHelper(worst._0_4_,1,a_parVars);
  return;
}

Assistant:

static void PickSeeds(ON_RTreePartitionVars* a_parVars)
{
  int seed0 = 0, seed1 = 1;
  double worst, waste;
  double area[ON_RTree_MAX_NODE_COUNT+1];

  for(int index=0; index<a_parVars->m_total; ++index)
  {
    area[index] = CalcRectVolumeHelper(&a_parVars->m_branchBuf[index].m_rect);
  }

  worst = -a_parVars->m_coverSplitArea - 1;
  for(int indexA=0; indexA < a_parVars->m_total-1; ++indexA)
  {
    for(int indexB = indexA+1; indexB < a_parVars->m_total; ++indexB)
    {
      ON_RTreeBBox oneRect = CombineRectHelper(&a_parVars->m_branchBuf[indexA].m_rect, &a_parVars->m_branchBuf[indexB].m_rect);
      waste = CalcRectVolumeHelper(&oneRect) - area[indexA] - area[indexB];
      if(waste > worst)
      {
        worst = waste;
        seed0 = indexA;
        seed1 = indexB;
      }
    }
  }
  ClassifyHelper(seed0, 0, a_parVars);
  ClassifyHelper(seed1, 1, a_parVars);
}